

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void MOJOSHADER_glSetVertexAttribDivisor(MOJOSHADER_usage usage,int index,uint divisor)

{
  GLuint GVar1;
  MOJOSHADER_glProgram *pMVar2;
  long lVar3;
  
  if (ctx->have_GL_ARB_instanced_arrays != 0) {
    pMVar2 = ctx->bound_program;
    if ((pMVar2 != (MOJOSHADER_glProgram *)0x0) && (pMVar2->vertex != (MOJOSHADER_glShader *)0x0)) {
      GVar1 = pMVar2->vertex_attrib_loc[usage][index];
      lVar3 = (long)(int)GVar1;
      if ((lVar3 != -1) && (ctx->attr_divisor[lVar3] != divisor)) {
        (*ctx->glVertexAttribDivisorARB)(GVar1,divisor);
        ctx->attr_divisor[lVar3] = divisor;
      }
    }
    return;
  }
  __assert_fail("ctx->have_GL_ARB_instanced_arrays",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                ,0x933,
                "void MOJOSHADER_glSetVertexAttribDivisor(MOJOSHADER_usage, int, unsigned int)");
}

Assistant:

void MOJOSHADER_glSetVertexAttribDivisor(MOJOSHADER_usage usage,
                                         int index, unsigned int divisor)
{
    assert(ctx->have_GL_ARB_instanced_arrays);

    if ((ctx->bound_program == NULL) || (ctx->bound_program->vertex == NULL))
        return;

    const GLint gl_index = ctx->bound_program->vertex_attrib_loc[usage][index];

    if (gl_index == -1)
        return; // Nothing to do, this shader doesn't use this stream.

    if (divisor != ctx->attr_divisor[gl_index])
    {
        ctx->glVertexAttribDivisorARB(gl_index, divisor);
        ctx->attr_divisor[gl_index] = divisor;
    } // if
}